

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-utils.h
# Opt level: O0

int64_t sxpos(int32_t n,int32_t i,int32_t j)

{
  int local_30;
  int64_t result;
  int32_t u;
  int32_t l;
  int32_t j_local;
  int32_t i_local;
  int32_t n_local;
  
  if (i != j) {
    local_30 = i;
    if (i < j) {
      local_30 = j;
      j = i;
    }
    return (long)((j * n + local_30) - ((j + 1) * (j + 2)) / 2);
  }
  __assert_fail("i != j",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                ,0x2c,"int64_t sxpos(int32_t, int32_t, int32_t)");
}

Assistant:

static inline int64_t sxpos(int32_t n, int32_t i, int32_t j) {
    assert(i != j);

    int32_t l = MIN(i, j);
    int32_t u = MAX(i, j);

    int64_t result = l * n + u - ((l + 1) * (l + 2)) / 2;
    return result;
}